

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

Vec_Ptr_t * Ivy_FraigCollectSuper(Ivy_Obj_t *pObj,int fUseMuxes)

{
  Vec_Ptr_t *vSuper;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                  ,0x9c5,"Vec_Ptr_t *Ivy_FraigCollectSuper(Ivy_Obj_t *, int)");
  }
  if ((*(uint *)&pObj->field_0x8 & 0xf) != 1) {
    vSuper = Vec_PtrAlloc(4);
    Ivy_FraigCollectSuper_rec(pObj,vSuper,1,fUseMuxes);
    return vSuper;
  }
  __assert_fail("!Ivy_ObjIsPi(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyFraig.c"
                ,0x9c6,"Vec_Ptr_t *Ivy_FraigCollectSuper(Ivy_Obj_t *, int)");
}

Assistant:

Vec_Ptr_t * Ivy_FraigCollectSuper( Ivy_Obj_t * pObj, int fUseMuxes )
{
    Vec_Ptr_t * vSuper;
    assert( !Ivy_IsComplement(pObj) );
    assert( !Ivy_ObjIsPi(pObj) );
    vSuper = Vec_PtrAlloc( 4 );
    Ivy_FraigCollectSuper_rec( pObj, vSuper, 1, fUseMuxes );
    return vSuper;
}